

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O3

bool __thiscall
astar::AStar::InOpenZone
          (AStar *this,
          priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
          *pc,Point *point)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pPVar5;
  pointer pPVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  do {
    pPVar5 = (pc->c).
             super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar6 = (pc->c).
             super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar5 == pPVar6) break;
    iVar1 = (pPVar5->point).x;
    iVar2 = (pPVar5->point).y;
    this_00 = (pPVar5->parent).
              super___shared_ptr<astar::AStar::PointCost,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    std::
    priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
    ::pop(pc);
    iVar3 = point->x;
    iVar4 = point->y;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  } while (iVar2 != iVar4 || iVar1 != iVar3);
  return pPVar5 != pPVar6;
}

Assistant:

bool InOpenZone(std::priority_queue<PointCost> pc, const Point& point)
    {
        while (!pc.empty()) {
            auto tmp = pc.top();
            pc.pop();
            if (point == tmp.point) {
                return true;
            }
        }
        return false;
    }